

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minipointcounter_test.cpp
# Opt level: O0

void __thiscall
TEST_MinipointCounterTest_HighestPoints_TestShell::
~TEST_MinipointCounterTest_HighestPoints_TestShell
          (TEST_MinipointCounterTest_HighestPoints_TestShell *this)

{
  TEST_MinipointCounterTest_HighestPoints_TestShell *mem;
  TEST_MinipointCounterTest_HighestPoints_TestShell *this_local;
  
  mem = this;
  ~TEST_MinipointCounterTest_HighestPoints_TestShell(this);
  operator_delete(mem,(size_t)this);
  return;
}

Assistant:

TEST(MinipointCounterTest, HighestPoints)
{
	s.setRoundWind(Tile::EastWind);
	s.setSeatWind(Tile::EastWind);

	addQuad(Tile::OneOfCharacters, false);
	addQuad(Tile::RedDragon, false);
	addQuad(Tile::SouthWind, true);
	addSequence(Tile::SevenOfCircles, false);
	addPair(Tile::EastWind);

	s.selfDrawn();

	CHECK_EQUAL(108, m.total(false));
	CHECK_EQUAL(110, m.total());
}